

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O1

int wally_base64_from_bytes(uchar *bytes,size_t bytes_len,uint32_t flags,char **output)

{
  size_t sVar1;
  char *dest;
  ssize_t sVar2;
  int iVar3;
  
  if (output != (char **)0x0) {
    *output = (char *)0x0;
  }
  iVar3 = -2;
  if ((flags == 0 && output != (char **)0x0) && (bytes_len != 0 && bytes != (uchar *)0x0)) {
    sVar1 = base64_encoded_length(bytes_len);
    sVar1 = sVar1 + 1;
    dest = (char *)wally_malloc(sVar1);
    if (dest == (char *)0x0) {
      iVar3 = -3;
    }
    else {
      sVar2 = base64_encode_using_maps(&base64_maps_rfc4648,dest,sVar1,(char *)bytes,bytes_len);
      if (sVar2 < 0) {
        clear_and_free(dest,sVar1);
      }
      else {
        *output = dest;
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

int wally_base64_from_bytes(const unsigned char *bytes, size_t bytes_len,
                            uint32_t flags, char **output)
{
    char *encoded;
    size_t encoded_len;

    if (output)
        *output = NULL;

    if (!bytes || !bytes_len || flags || !output)
        return WALLY_EINVAL;

    encoded_len = base64_encoded_length(bytes_len) + 1; /* +1 for NUL */
    if ((encoded = wally_malloc(encoded_len)) == NULL)
        return WALLY_ENOMEM;

    if (base64_encode(encoded, encoded_len, (const char *)bytes, bytes_len) < 0) {
        clear_and_free(encoded, encoded_len);
        return WALLY_EINVAL;
    }
    *output = encoded;
    return WALLY_OK;
}